

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow *window,ImRect *item_rect,ImGuiScrollFlags flags)

{
  float fVar1;
  ImGuiWindow *window_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float local_e8;
  float local_e0;
  bool local_d1;
  bool local_a1;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImRect local_90;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 next_scroll;
  float target_y;
  float target_x;
  bool can_be_fully_visible_y;
  bool can_be_fully_visible_x;
  bool fully_visible_y;
  bool fully_visible_x;
  ImGuiScrollFlags in_flags;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined1 local_40 [8];
  ImRect window_rect;
  ImGuiContext *g;
  ImGuiScrollFlags flags_local;
  ImRect *item_rect_local;
  ImGuiWindow *window_local;
  ImVec2 delta_scroll;
  
  window_rect.Max = (ImVec2)GImGui;
  ImVec2::ImVec2(&local_50,1.0,1.0);
  local_48 = ::operator-(&(window->InnerRect).Min,&local_50);
  ImVec2::ImVec2((ImVec2 *)&can_be_fully_visible_y,1.0,1.0);
  local_58 = operator+(&(window->InnerRect).Max,(ImVec2 *)&can_be_fully_visible_y);
  ImRect::ImRect((ImRect *)local_40,&local_48,&local_58);
  local_a1 = true;
  if ((flags & 0x15U) != 0) {
    local_a1 = ImIsPowerOfTwo(flags & 0x15);
  }
  if (local_a1 == false) {
    __assert_fail("(flags & ImGuiScrollFlags_MaskX_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskX_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x21f4,
                  "ImVec2 ImGui::ScrollToRectEx(ImGuiWindow *, const ImRect &, ImGuiScrollFlags)");
  }
  local_d1 = true;
  if ((flags & 0x2aU) != 0) {
    local_d1 = ImIsPowerOfTwo(flags & 0x2a);
  }
  if (local_d1 != false) {
    g._4_4_ = flags;
    if (((flags & 0x15U) == 0) && ((window->ScrollbarX & 1U) != 0)) {
      g._4_4_ = flags | 1;
    }
    if ((g._4_4_ & 0x2a) == 0) {
      uVar6 = 2;
      if ((window->Appearing & 1U) != 0) {
        uVar6 = 0x20;
      }
      g._4_4_ = uVar6 | g._4_4_;
    }
    bVar2 = false;
    if ((float)local_40._0_4_ <= (item_rect->Min).x) {
      bVar2 = (item_rect->Max).x <= window_rect.Min.x;
    }
    bVar3 = false;
    if ((float)local_40._4_4_ <= (item_rect->Min).y) {
      bVar3 = (item_rect->Max).y <= window_rect.Min.y;
    }
    fVar7 = ImRect::GetWidth(item_rect);
    fVar1 = *(float *)((long)window_rect.Max + 0x37c4);
    fVar8 = ImRect::GetWidth((ImRect *)local_40);
    bVar4 = fVar8 < fVar1 + fVar1 + fVar7;
    fVar7 = ImRect::GetHeight(item_rect);
    fVar1 = *(float *)((long)window_rect.Max + 0x37c8);
    fVar8 = ImRect::GetHeight((ImRect *)local_40);
    bVar5 = fVar8 < fVar1 + fVar1 + fVar7;
    if (((g._4_4_ & 1) == 0) || (bVar2)) {
      if ((((g._4_4_ & 4) != 0) && (!bVar2)) || ((g._4_4_ & 0x10) != 0)) {
        if (bVar4) {
          local_e0 = (item_rect->Min).x;
        }
        else {
          fVar1 = (item_rect->Min).x;
          fVar7 = (item_rect->Max).x;
          fVar8 = ImRect::GetWidth(&window->InnerRect);
          local_e0 = ImFloor(((fVar1 + fVar7) - fVar8) * 0.5);
        }
        next_scroll.y = local_e0;
        SetScrollFromPosX(window,local_e0 - (window->Pos).x,0.0);
      }
    }
    else if (((item_rect->Min).x < (float)local_40._0_4_) || (bVar4)) {
      SetScrollFromPosX(window,((item_rect->Min).x - *(float *)((long)window_rect.Max + 0x37c4)) -
                               (window->Pos).x,0.0);
    }
    else if (window_rect.Min.x <= (item_rect->Max).x) {
      SetScrollFromPosX(window,((item_rect->Max).x + *(float *)((long)window_rect.Max + 0x37c4)) -
                               (window->Pos).x,1.0);
    }
    if (((g._4_4_ & 2) == 0) || (bVar3)) {
      if ((((g._4_4_ & 8) != 0) && (!bVar3)) || ((g._4_4_ & 0x20) != 0)) {
        if (bVar5) {
          local_e8 = (item_rect->Min).y;
        }
        else {
          fVar1 = (item_rect->Min).y;
          fVar7 = (item_rect->Max).y;
          fVar8 = ImRect::GetHeight(&window->InnerRect);
          local_e8 = ImFloor(((fVar1 + fVar7) - fVar8) * 0.5);
        }
        next_scroll.x = local_e8;
        SetScrollFromPosY(window,local_e8 - (window->Pos).y,0.0);
      }
    }
    else if (((item_rect->Min).y < (float)local_40._4_4_) || (bVar5)) {
      SetScrollFromPosY(window,((item_rect->Min).y - *(float *)((long)window_rect.Max + 0x37c8)) -
                               (window->Pos).y,0.0);
    }
    else if (window_rect.Min.y <= (item_rect->Max).y) {
      SetScrollFromPosY(window,((item_rect->Max).y + *(float *)((long)window_rect.Max + 0x37c8)) -
                               (window->Pos).y,1.0);
    }
    local_78 = CalcNextScrollFromScrollTargetAndClamp(window);
    window_local = (ImGuiWindow *)::operator-(&local_78,&window->Scroll);
    if (((g._4_4_ & 0x40) == 0) && ((window->Flags & 0x1000000U) != 0)) {
      target_x = (float)flags;
      if ((flags & 0x14U) != 0) {
        target_x = (float)(flags & 0xffffffeaU | 1);
      }
      if (((uint)target_x & 0x28) != 0) {
        target_x = (float)((uint)target_x & 0xffffffd5 | 2);
      }
      window_00 = window->ParentWindow;
      local_98 = ::operator-(&item_rect->Min,(ImVec2 *)&window_local);
      local_a0 = ::operator-(&item_rect->Max,(ImVec2 *)&window_local);
      ImRect::ImRect(&local_90,&local_98,&local_a0);
      local_80 = ScrollToRectEx(window_00,&local_90,(ImGuiScrollFlags)target_x);
      operator+=((ImVec2 *)&window_local,&local_80);
    }
    return (ImVec2)window_local;
  }
  __assert_fail("(flags & ImGuiScrollFlags_MaskY_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskY_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                ,0x21f5,
                "ImVec2 ImGui::ScrollToRectEx(ImGuiWindow *, const ImRect &, ImGuiScrollFlags)");
}

Assistant:

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow* window, const ImRect& item_rect, ImGuiScrollFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    // Check that only one behavior is selected per axis
    IM_ASSERT((flags & ImGuiScrollFlags_MaskX_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskX_));
    IM_ASSERT((flags & ImGuiScrollFlags_MaskY_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskY_));

    // Defaults
    ImGuiScrollFlags in_flags = flags;
    if ((flags & ImGuiScrollFlags_MaskX_) == 0 && window->ScrollbarX)
        flags |= ImGuiScrollFlags_KeepVisibleEdgeX;
    if ((flags & ImGuiScrollFlags_MaskY_) == 0)
        flags |= window->Appearing ? ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeY;

    const bool fully_visible_x = item_rect.Min.x >= window_rect.Min.x && item_rect.Max.x <= window_rect.Max.x;
    const bool fully_visible_y = item_rect.Min.y >= window_rect.Min.y && item_rect.Max.y <= window_rect.Max.y;
    const bool can_be_fully_visible_x = (item_rect.GetWidth() + g.Style.ItemSpacing.x * 2.0f) <= window_rect.GetWidth();
    const bool can_be_fully_visible_y = (item_rect.GetHeight() + g.Style.ItemSpacing.y * 2.0f) <= window_rect.GetHeight();

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeX) && !fully_visible_x)
    {
        if (item_rect.Min.x < window_rect.Min.x || !can_be_fully_visible_x)
            SetScrollFromPosX(window, item_rect.Min.x - g.Style.ItemSpacing.x - window->Pos.x, 0.0f);
        else if (item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x + g.Style.ItemSpacing.x - window->Pos.x, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterX) && !fully_visible_x) || (flags & ImGuiScrollFlags_AlwaysCenterX))
    {
        float target_x = can_be_fully_visible_x ? ImFloor((item_rect.Min.x + item_rect.Max.x - window->InnerRect.GetWidth()) * 0.5f) : item_rect.Min.x;
        SetScrollFromPosX(window, target_x - window->Pos.x, 0.0f);
    }

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeY) && !fully_visible_y)
    {
        if (item_rect.Min.y < window_rect.Min.y || !can_be_fully_visible_y)
            SetScrollFromPosY(window, item_rect.Min.y - g.Style.ItemSpacing.y - window->Pos.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y + g.Style.ItemSpacing.y - window->Pos.y, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterY) && !fully_visible_y) || (flags & ImGuiScrollFlags_AlwaysCenterY))
    {
        float target_y = can_be_fully_visible_y ? ImFloor((item_rect.Min.y + item_rect.Max.y - window->InnerRect.GetHeight()) * 0.5f) : item_rect.Min.y;
        SetScrollFromPosY(window, target_y - window->Pos.y, 0.0f);
    }

    ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
    ImVec2 delta_scroll = next_scroll - window->Scroll;

    // Also scroll parent window to keep us into view if necessary
    if (!(flags & ImGuiScrollFlags_NoScrollParent) && (window->Flags & ImGuiWindowFlags_ChildWindow))
    {
        // FIXME-SCROLL: May be an option?
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterX | ImGuiScrollFlags_KeepVisibleCenterX)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskX_) | ImGuiScrollFlags_KeepVisibleEdgeX;
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterY | ImGuiScrollFlags_KeepVisibleCenterY)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskY_) | ImGuiScrollFlags_KeepVisibleEdgeY;
        delta_scroll += ScrollToRectEx(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll), in_flags);
    }

    return delta_scroll;
}